

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O3

duckdb_result_type duckdb_result_return_type(duckdb_result result)

{
  idx_t this;
  char *pcVar1;
  pointer pQVar2;
  ulong uVar3;
  duckdb_result_type dVar4;
  
  this = result.deprecated_rows_changed;
  dVar4 = DUCKDB_RESULT_TYPE_INVALID;
  if (result.deprecated_rows_changed != 0) {
    pcVar1 = duckdb_result_error((duckdb_result *)&stack0x00000008);
    dVar4 = DUCKDB_RESULT_TYPE_INVALID;
    if (pcVar1 == (char *)0x0) {
      pQVar2 = duckdb::
               unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
               operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)this);
      uVar3 = (ulong)(pQVar2->super_BaseQueryResult).properties.return_type;
      if (uVar3 < 3) {
        dVar4 = *(duckdb_result_type *)(&DAT_01e0dc58 + uVar3 * 4);
      }
    }
  }
  return dVar4;
}

Assistant:

duckdb_result_type duckdb_result_return_type(duckdb_result result) {
	if (!result.internal_data || duckdb_result_error(&result) != nullptr) {
		return DUCKDB_RESULT_TYPE_INVALID;
	}
	auto &result_data = *(reinterpret_cast<duckdb::DuckDBResultData *>(result.internal_data));
	switch (result_data.result->properties.return_type) {
	case duckdb::StatementReturnType::CHANGED_ROWS:
		return DUCKDB_RESULT_TYPE_CHANGED_ROWS;
	case duckdb::StatementReturnType::NOTHING:
		return DUCKDB_RESULT_TYPE_NOTHING;
	case duckdb::StatementReturnType::QUERY_RESULT:
		return DUCKDB_RESULT_TYPE_QUERY_RESULT;
	default:
		return DUCKDB_RESULT_TYPE_INVALID;
	}
}